

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::utp_stream::
async_read_some<boost::asio::mutable_buffers_1,boost::asio::ssl::detail::io_op<libtorrent::utp_stream,boost::asio::ssl::detail::handshake_op,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>>
          (utp_stream *this,mutable_buffers_1 *buffers,
          io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>
          *handler)

{
  io_context *piVar1;
  io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>
  *__f;
  bool bVar2;
  size_t sVar3;
  void *buf;
  unsigned_long local_1d8;
  error_code local_1d0;
  type local_1c0;
  mutable_buffer *local_148;
  mutable_buffer *end;
  mutable_buffer *i;
  size_t bytes_added;
  basic_errors local_124;
  type local_120;
  unsigned_long local_a0;
  basic_errors local_94;
  type local_90;
  io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>
  *local_20;
  io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>
  *handler_local;
  mutable_buffers_1 *buffers_local;
  utp_stream *this_local;
  
  local_20 = handler;
  handler_local =
       (io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>
        *)buffers;
  buffers_local = (mutable_buffers_1 *)this;
  if (this->m_impl == (utp_socket_impl *)0x0) {
    piVar1 = this->m_io_service;
    local_94 = not_connected;
    local_a0 = 0;
    std::
    bind<void,boost::asio::ssl::detail::io_op<libtorrent::utp_stream,boost::asio::ssl::detail::handshake_op,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>const&,boost::asio::error::basic_errors,unsigned_long>
              (&local_90,handler,&local_94,&local_a0);
    boost::asio::io_context::
    post<std::_Bind_result<void,boost::asio::ssl::detail::io_op<libtorrent::utp_stream,boost::asio::ssl::detail::handshake_op,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>(boost::asio::error::basic_errors,unsigned_long)>>
              (piVar1,&local_90);
    std::
    _Bind_result<void,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_(boost::asio::error::basic_errors,_unsigned_long)>
    ::~_Bind_result(&local_90);
  }
  else {
    bVar2 = std::function::operator_cast_to_bool((function *)&this->m_read_handler);
    if (bVar2) {
      piVar1 = this->m_io_service;
      local_124 = operation_not_supported;
      bytes_added = 0;
      std::
      bind<void,boost::asio::ssl::detail::io_op<libtorrent::utp_stream,boost::asio::ssl::detail::handshake_op,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>const&,boost::asio::error::basic_errors,unsigned_long>
                (&local_120,local_20,&local_124,&bytes_added);
      boost::asio::io_context::
      post<std::_Bind_result<void,boost::asio::ssl::detail::io_op<libtorrent::utp_stream,boost::asio::ssl::detail::handshake_op,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>(boost::asio::error::basic_errors,unsigned_long)>>
                (piVar1,&local_120);
      std::
      _Bind_result<void,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_(boost::asio::error::basic_errors,_unsigned_long)>
      ::~_Bind_result(&local_120);
    }
    else {
      i = (mutable_buffer *)0x0;
      end = boost::asio::buffer_sequence_begin<boost::asio::mutable_buffers_1>
                      ((mutable_buffers_1 *)handler_local,(type *)0x0);
      local_148 = boost::asio::buffer_sequence_end<boost::asio::mutable_buffers_1>
                            ((mutable_buffers_1 *)handler_local,(type *)0x0);
      for (; __f = local_20, end != local_148; end = end + 1) {
        sVar3 = boost::asio::buffer_size<boost::asio::mutable_buffer>(end);
        if (sVar3 != 0) {
          buf = boost::asio::buffer_cast<void*>(end);
          sVar3 = boost::asio::buffer_size<boost::asio::mutable_buffer>(end);
          add_read_buffer(this,buf,sVar3);
          sVar3 = boost::asio::buffer_size<boost::asio::mutable_buffer>(end);
          i = (mutable_buffer *)((long)&i->data_ + sVar3);
        }
      }
      if (i == (mutable_buffer *)0x0) {
        piVar1 = this->m_io_service;
        boost::system::error_code::error_code(&local_1d0);
        local_1d8 = 0;
        std::
        bind<void,boost::asio::ssl::detail::io_op<libtorrent::utp_stream,boost::asio::ssl::detail::handshake_op,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>const&,boost::system::error_code,unsigned_long>
                  (&local_1c0,__f,&local_1d0,&local_1d8);
        boost::asio::io_context::
        post<std::_Bind_result<void,boost::asio::ssl::detail::io_op<libtorrent::utp_stream,boost::asio::ssl::detail::handshake_op,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>(boost::system::error_code,unsigned_long)>>
                  (piVar1,&local_1c0);
        std::
        _Bind_result<void,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_(boost::system::error_code,_unsigned_long)>
        ::~_Bind_result(&local_1c0);
      }
      else {
        std::function<void(boost::system::error_code_const&,unsigned_long)>::operator=
                  ((function<void(boost::system::error_code_const&,unsigned_long)> *)
                   &this->m_read_handler,local_20);
        issue_read(this);
      }
    }
  }
  return;
}

Assistant:

void async_read_some(Mutable_Buffers const& buffers, Handler const& handler)
	{
		if (m_impl == nullptr)
		{
			m_io_service.post(std::bind<void>(handler, boost::asio::error::not_connected, std::size_t(0)));
			return;
		}

		TORRENT_ASSERT(!m_read_handler);
		if (m_read_handler)
		{
			m_io_service.post(std::bind<void>(handler, boost::asio::error::operation_not_supported, std::size_t(0)));
			return;
		}
		std::size_t bytes_added = 0;
#if BOOST_VERSION >= 106600
		for (auto i = buffer_sequence_begin(buffers)
			, end(buffer_sequence_end(buffers)); i != end; ++i)
#else
		for (typename Mutable_Buffers::const_iterator i = buffers.begin()
			, end(buffers.end()); i != end; ++i)
#endif
		{
			if (buffer_size(*i) == 0) continue;
			using boost::asio::buffer_cast;
			using boost::asio::buffer_size;
			add_read_buffer(buffer_cast<void*>(*i), buffer_size(*i));
			bytes_added += buffer_size(*i);
		}
		if (bytes_added == 0)
		{
			// if we're reading 0 bytes, post handler immediately
			// asio's SSL layer depends on this behavior
			m_io_service.post(std::bind<void>(handler, error_code(), std::size_t(0)));
			return;
		}

		m_read_handler = handler;
		issue_read();
	}